

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O1

bool cfd::core::AdaptorUtil::Verify
               (AdaptorSignature *adaptor_sig,AdaptorProof *proof,Pubkey *adaptor,ByteData256 *msg,
               Pubkey *pubkey)

{
  pointer msg32;
  pointer adaptor_sig65;
  int iVar1;
  secp256k1_context_struct *ctx;
  secp256k1_pubkey_conflict secp_adaptor;
  secp256k1_pubkey_conflict secp_pubkey;
  ByteData local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  void *local_c8 [3];
  secp256k1_pubkey_conflict local_b0;
  secp256k1_pubkey_conflict local_70;
  
  ctx = wally_get_secp_context();
  ParsePubkey(&local_70,pubkey);
  ParsePubkey(&local_b0,adaptor);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)adaptor_sig);
  ByteData::GetBytes(&local_e0,(ByteData *)local_c8);
  adaptor_sig65 =
       local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  ByteData256::GetBytes(&local_f8,msg);
  msg32 = local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)proof);
  ByteData::GetBytes(&local_110,&local_128);
  iVar1 = secp256k1_ecdsa_adaptor_sig_verify
                    (ctx,adaptor_sig65,&local_70,msg32,&local_b0,
                     local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8[0] != (void *)0x0) {
    operator_delete(local_c8[0]);
  }
  return iVar1 == 1;
}

Assistant:

bool AdaptorUtil::Verify(
    const AdaptorSignature &adaptor_sig, const AdaptorProof &proof,
    const Pubkey &adaptor, const ByteData256 &msg, const Pubkey &pubkey) {
  auto ctx = wally_get_secp_context();
  auto secp_pubkey = ParsePubkey(pubkey);
  auto secp_adaptor = ParsePubkey(adaptor);
  return secp256k1_ecdsa_adaptor_sig_verify(
             ctx, adaptor_sig.GetData().GetBytes().data(), &secp_pubkey,
             msg.GetBytes().data(), &secp_adaptor,
             proof.GetData().GetBytes().data()) == 1;
}